

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O1

uint32_t __thiscall
Handler::CalculateMigrateValue
          (Handler *this,PurchasedServer *purchasedServer,VirtualMachine *vm,LOCATION *location)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  LOCATION LVar6;
  uint32_t uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  
  uVar1 = (this->servers).super__Vector_base<Server,_std::allocator<Server>_>._M_impl.
          super__Vector_impl_data._M_start[purchasedServer->serverIdx].energyCost;
  uVar2 = vm->cpuCore;
  uVar3 = vm->memorySize;
  LVar6 = *location;
  if (LVar6 == NODE_A) {
    bVar8 = CheckCapacity(purchasedServer,vm,location);
    if (!bVar8) {
      return 0;
    }
    iVar9 = (*(int *)&purchasedServer->remainMemorySizeA - (uint)uVar3 & 0xffff) *
            this->migrateMemorySizeParameter +
            (*(int *)&purchasedServer->remainCpuCoreA - (uint)uVar2 & 0xffff) *
            this->migrateCpuCoreParameter;
    uVar7 = this->migrateEnergyCostParameter;
  }
  else {
    if (LVar6 == NODE_B) {
      bVar8 = CheckCapacity(purchasedServer,vm,location);
      if (!bVar8) {
        return 0;
      }
      iVar9 = ((uint)purchasedServer->remainCpuCoreB - (uint)uVar2 & 0xffff) *
              this->migrateCpuCoreParameter;
      uVar10 = (uint)purchasedServer->remainMemorySizeB - (uint)uVar3 & 0xffff;
    }
    else {
      if (LVar6 != ALL) {
        return 0;
      }
      bVar8 = CheckCapacity(purchasedServer,vm,location);
      if (!bVar8) {
        return 0;
      }
      uVar4 = purchasedServer->remainCpuCoreA;
      uVar5 = purchasedServer->remainMemorySizeA;
      iVar9 = (uint)(ushort)((uVar4 - (uVar2 & 0xfffe)) + purchasedServer->remainCpuCoreB) *
              this->migrateCpuCoreParameter;
      uVar10 = (uint)(ushort)((uVar5 - (uVar3 & 0xfffe)) + purchasedServer->remainMemorySizeB);
    }
    iVar9 = uVar10 * this->migrateMemorySizeParameter + iVar9;
    uVar7 = this->migrateEnergyCostParameter;
  }
  return uVar7 * uVar1 + iVar9;
}

Assistant:

uint32_t Handler::CalculateMigrateValue(const PurchasedServer &purchasedServer, const VirtualMachine &vm, const LOCATION &location) {
    uint16_t energyCost = servers[purchasedServer.serverIdx].energyCost;
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    if (location == ALL && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t halfCpuCore = cpuCore >> 1u;
        uint16_t halfMemorySize = memorySize >> 1u;
        uint16_t remainCpuCoreA = purchasedServer.remainCpuCoreA - halfCpuCore;
        uint16_t remainMemorySizeA = purchasedServer.remainMemorySizeA - halfMemorySize;
        uint16_t remainCpuCoreB = purchasedServer.remainCpuCoreB - halfCpuCore;
        uint16_t remainMemorySizeB = purchasedServer.remainMemorySizeB - halfMemorySize;
        return CalculateMigrateValue(remainCpuCoreA + remainCpuCoreB, remainMemorySizeA + remainMemorySizeB, energyCost);
    }

    if (location == NODE_A && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t remainCpuCoreA = purchasedServer.remainCpuCoreA - cpuCore;
        uint16_t remainMemorySizeA = purchasedServer.remainMemorySizeA - memorySize;
        return CalculateMigrateValue(remainCpuCoreA, remainMemorySizeA, energyCost);
    }

    if (location == NODE_B && CheckCapacity(purchasedServer, vm, location)) {
        uint16_t remainCpuCoreB = purchasedServer.remainCpuCoreB - cpuCore;
        uint16_t remainMemorySizeB = purchasedServer.remainMemorySizeB - memorySize;
        return CalculateMigrateValue(remainCpuCoreB, remainMemorySizeB, energyCost);
    }

    return 0u;
}